

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::static_value(Fl_Input_ *this,char *str,int len)

{
  int iVar1;
  bool bVar2;
  int local_38;
  int local_28;
  int i;
  int len_local;
  char *str_local;
  Fl_Input_ *this_local;
  
  Fl_Widget::clear_changed(&this->super_Fl_Widget);
  if (undowidget == this) {
    undowidget = (Fl_Input_ *)0x0;
  }
  if ((str == this->value_) && (len == this->size_)) {
    this_local._4_4_ = 0;
  }
  else {
    if (len == 0) {
      if (this->size_ == 0) {
        return 0;
      }
      this->size_ = 0;
      this->value_ = "";
      this->yscroll_ = 0;
      this->xscroll_ = 0;
      minimal_update(this,0);
    }
    else {
      if ((this->xscroll_ == 0) && (this->yscroll_ == 0)) {
        local_28 = 0;
        if (this->value_ != (char *)0x0) {
          while( true ) {
            bVar2 = false;
            if ((local_28 < this->size_) && (bVar2 = false, local_28 < len)) {
              bVar2 = str[local_28] == this->value_[local_28];
            }
            if (!bVar2) break;
            local_28 = local_28 + 1;
          }
          if ((local_28 == this->size_) && (local_28 == len)) {
            return 0;
          }
        }
        minimal_update(this,local_28);
      }
      else {
        this->yscroll_ = 0;
        this->xscroll_ = 0;
        minimal_update(this,0);
      }
      this->value_ = str;
      this->size_ = len;
    }
    iVar1 = readonly(this);
    if (iVar1 == 0) {
      local_38 = size(this);
    }
    else {
      local_38 = 0;
    }
    position(this,local_38);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::static_value(const char* str, int len) {
  clear_changed();
  if (undowidget == this) undowidget = 0;
  if (str == value_ && len == size_) return 0;
  if (len) { // non-empty new value:
    if (xscroll_ || yscroll_) {
      xscroll_ = yscroll_ = 0;
      minimal_update(0);
    } else {
      int i = 0;
      // find first different character:
      if (value_) {
	for (; i<size_ && i<len && str[i]==value_[i]; i++) {/*empty*/}
	if (i==size_ && i==len) return 0;
      }
      minimal_update(i);
    }
    value_ = str;
    size_ = len;
  } else { // empty new value:
    if (!size_) return 0; // both old and new are empty.
    size_ = 0;
    value_ = "";
    xscroll_ = yscroll_ = 0;
    minimal_update(0);
  }
  position(readonly() ? 0 : size());
  return 1;
}